

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void delete_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  DLIST_bb_insn_t_remove(&bb_insn->bb->bb_insns,bb_insn);
  bb_insn->insn->data = (void *)0x0;
  clear_bb_insn_dead_vars(gen_ctx,bb_insn);
  if (bb_insn->call_hard_reg_args != (bitmap_t)0x0) {
    bitmap_destroy(bb_insn->call_hard_reg_args);
  }
  free(bb_insn);
  return;
}

Assistant:

static void delete_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  DLIST_REMOVE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn);
  bb_insn->insn->data = NULL;
  clear_bb_insn_dead_vars (gen_ctx, bb_insn);
  if (bb_insn->call_hard_reg_args != NULL) bitmap_destroy (bb_insn->call_hard_reg_args);
  free (bb_insn);
}